

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O1

void anm_write(anm_archive_t *anm,char *filename)

{
  short sVar1;
  uint uVar2;
  long *plVar3;
  char *pcVar4;
  uint *puVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  FILE *__stream;
  long lVar14;
  size_t sVar15;
  long lVar16;
  size_t sVar17;
  long *plVar18;
  uint uVar19;
  size_t sVar20;
  int iVar21;
  list_node_t *plVar22;
  long *plVar23;
  short *buffer;
  ulong uVar24;
  anm_instr0_t new_instr;
  undefined8 local_70;
  long local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  long *local_50;
  list_node_t *local_48;
  long local_40;
  ulong local_38;
  
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    anm_write_cold_1();
    uVar11 = *(uint *)((long)filename + 0xc);
    uVar19 = *(uint *)filename;
    uVar2 = *(uint *)((long)filename + 0x10);
    uVar12 = *(uint *)((long)filename + 0x14);
    uVar8 = *(uint *)((long)filename + 0x18);
    uVar9 = *(uint *)((long)filename + 0x1c);
    uVar13 = *(uint *)((long)filename + 0x20);
    uVar10 = *(uint *)((long)filename + 0x24);
    *(uint *)filename = (uint)(ushort)*(uint *)((long)filename + 4);
    *(uint *)((long)filename + 4) = (uint)*(ushort *)((long)filename + 6);
    *(uint *)((long)filename + 8) = 0;
    *(uint *)((long)filename + 0xc) = (uint)*(ushort *)((long)filename + 10);
    *(uint *)((long)filename + 0x10) = (uint)(ushort)uVar11;
    *(uint *)((long)filename + 0x14) = (uint)*(ushort *)((long)filename + 0xe);
    *(uint *)((long)filename + 0x18) = 0;
    *(uint *)((long)filename + 0x1c) = uVar2;
    *(uint *)((long)filename + 0x20) = (uint)(ushort)uVar12;
    *(uint *)((long)filename + 0x24) = (uint)*(ushort *)((long)filename + 0x16);
    *(uint *)((long)filename + 0x28) = uVar19;
    *(uint *)((long)filename + 0x2c) = uVar8;
    *(uint *)((long)filename + 0x30) = uVar9;
    *(short *)((long)filename + 0x34) = (short)uVar13;
    *(undefined2 *)((long)filename + 0x36) = *(undefined2 *)((long)filename + 0x22);
    *(uint *)((long)filename + 0x38) = uVar10;
    *(uint *)((long)filename + 0x3c) = 0;
    return;
  }
  plVar22 = (list_node_t *)&anm->entries;
  do {
    plVar22 = plVar22->next;
    if (plVar22 == (list_node_t *)0x0) {
      fclose(__stream);
      return;
    }
    plVar3 = (long *)plVar22->data;
    lVar14 = file_tell((FILE *)__stream);
    sVar15 = strlen((char *)plVar3[2]);
    plVar23 = plVar3 + 4;
    local_54 = 1;
    uVar19 = 0;
    plVar18 = plVar23;
    do {
      local_38 = (ulong)uVar19;
      plVar18 = (long *)*plVar18;
      local_54 = local_54 + -1;
      uVar19 = uVar19 + 1;
    } while (plVar18 != (long *)0x0);
    local_50 = plVar3 + 6;
    local_58 = -local_54;
    local_5c = 0xffffffff;
    plVar18 = local_50;
    do {
      plVar18 = (long *)*plVar18;
      local_5c = local_5c + 1;
    } while (plVar18 != (long *)0x0);
    local_48 = plVar22;
    file_seek((FILE *)__stream,(ulong)local_58 * 4 + lVar14 + (ulong)local_5c * 8 + 0x40);
    lVar16 = file_tell((FILE *)__stream);
    *(int *)(*plVar3 + 0x1c) = (int)lVar16 - (int)lVar14;
    pcVar4 = (char *)plVar3[2];
    local_68 = lVar14;
    sVar17 = strlen(pcVar4);
    file_write((FILE *)__stream,pcVar4,sVar17);
    file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar15 & 0xf));
    if (((char *)plVar3[3] != (char *)0x0) && (*(int *)(*plVar3 + 0x28) == 0)) {
      sVar15 = strlen((char *)plVar3[3]);
      lVar14 = file_tell((FILE *)__stream);
      *(int *)(*plVar3 + 0x24) = (int)lVar14 - (int)local_68;
      pcVar4 = (char *)plVar3[3];
      sVar17 = strlen(pcVar4);
      file_write((FILE *)__stream,pcVar4,sVar17);
      file_write((FILE *)__stream,"",0x10 - (ulong)((uint)sVar15 & 0xf));
    }
    local_40 = file_tell((FILE *)__stream);
    while (plVar23 = (long *)*plVar23, plVar18 = local_50, plVar23 != (long *)0x0) {
      file_write((FILE *)__stream,(void *)plVar23[2],0x14);
    }
    while (lVar14 = local_68, plVar18 = (long *)*plVar18, plVar18 != (long *)0x0) {
      plVar23 = (long *)plVar18[2];
      lVar14 = file_tell((FILE *)__stream);
      *(int *)(*plVar23 + 4) = (int)lVar14 - (int)local_68;
      plVar23 = plVar23 + 1;
LAB_001083c5:
      uVar24 = local_70;
      plVar23 = (long *)*plVar23;
      if (plVar23 == (long *)0x0) {
        buffer = (short *)0x0;
      }
      else {
        buffer = (short *)plVar23[2];
      }
      if (plVar23 != (long *)0x0) {
        if (*(int *)(*plVar3 + 0x28) == 0) goto LAB_001083ff;
        if (*buffer == -1) {
          buffer[1] = 0;
          sVar20 = 8;
        }
        else {
          sVar1 = buffer[1];
          buffer[1] = sVar1 + 8U;
          sVar20 = (size_t)(ushort)(sVar1 + 8U);
        }
        goto LAB_00108444;
      }
      if (*(int *)(*plVar3 + 0x28) == 0) {
        local_70 = local_70 & 0xffffffff00000000;
        sVar20 = 4;
      }
      else {
        local_70 = 0xffff;
        sVar20 = 8;
      }
      file_write((FILE *)__stream,&local_70,sVar20);
    }
    iVar21 = (int)local_68;
    if (*(short *)(*plVar3 + 0x34) != 0) {
      lVar16 = file_tell((FILE *)__stream);
      *(int *)(*plVar3 + 0x30) = (int)lVar16 - iVar21;
      file_write((FILE *)__stream,(void *)plVar3[1],0x10);
      file_write((FILE *)__stream,(void *)plVar3[8],(ulong)*(uint *)(plVar3[1] + 0xc));
    }
    if (local_48->next == (list_node_t *)0x0) {
      uVar19 = 0;
    }
    else {
      lVar16 = file_tell((FILE *)__stream);
      uVar19 = (int)lVar16 - iVar21;
    }
    puVar5 = (uint *)*plVar3;
    puVar5[0xe] = uVar19;
    *puVar5 = local_58;
    puVar5[1] = local_5c;
    file_seek((FILE *)__stream,lVar14);
    lVar16 = local_68;
    puVar5 = (uint *)*plVar3;
    uVar19 = puVar5[10];
    if (uVar19 < 7) {
      file_write((FILE *)__stream,puVar5,0x40);
    }
    else {
      uVar8 = puVar5[1];
      uVar9 = puVar5[3];
      uVar10 = puVar5[4];
      uVar11 = puVar5[5];
      uVar2 = puVar5[7];
      uVar12 = puVar5[8];
      uVar13 = puVar5[9];
      uVar6 = *(undefined8 *)(puVar5 + 0xb);
      uVar7 = *(undefined8 *)(puVar5 + 0xd);
      puVar5[0] = 0;
      puVar5[1] = 0;
      puVar5[2] = 0;
      puVar5[3] = 0;
      puVar5[4] = 0;
      puVar5[5] = 0;
      puVar5[6] = 0;
      puVar5[7] = 0;
      puVar5[8] = 0;
      puVar5[9] = 0;
      puVar5[10] = 0;
      puVar5[0xb] = 0;
      puVar5[0xc] = 0;
      puVar5[0xd] = 0;
      puVar5[0xe] = 0;
      puVar5[0xf] = 0;
      *(short *)(puVar5 + 1) = (short)*puVar5;
      *(short *)((long)puVar5 + 6) = (short)uVar8;
      *(undefined2 *)(puVar5 + 2) = 0;
      *(short *)((long)puVar5 + 10) = (short)uVar9;
      *(short *)(puVar5 + 3) = (short)uVar10;
      *(short *)((long)puVar5 + 0xe) = (short)uVar11;
      puVar5[4] = uVar2;
      *(short *)(puVar5 + 5) = (short)uVar12;
      *(short *)((long)puVar5 + 0x16) = (short)uVar13;
      *puVar5 = uVar19;
      *(undefined8 *)(puVar5 + 6) = uVar6;
      *(undefined8 *)(puVar5 + 8) = uVar7;
      file_write((FILE *)__stream,(void *)*plVar3,0x40);
      convert_header_to_old((anm_header06_t *)*plVar3);
      lVar14 = lVar16;
    }
    plVar23 = local_50;
    plVar22 = local_48;
    if (local_54 != 0) {
      iVar21 = (int)local_40 - (int)lVar14;
      uVar24 = local_38 & 0xffffffff;
      do {
        local_70 = CONCAT44(local_70._4_4_,iVar21);
        file_write((FILE *)__stream,&local_70,4);
        iVar21 = iVar21 + 0x14;
        uVar24 = uVar24 - 1;
        plVar23 = local_50;
        plVar22 = local_48;
      } while (uVar24 != 0);
    }
    while (plVar23 = (long *)*plVar23, plVar23 != (long *)0x0) {
      file_write((FILE *)__stream,*(void **)plVar23[2],8);
    }
    file_seek((FILE *)__stream,lVar14 + (ulong)*(uint *)(*plVar3 + 0x38));
  } while( true );
LAB_001083ff:
  local_70._4_4_ = SUB84(uVar24,4);
  local_70._0_4_ = CONCAT13((char)buffer[1],CONCAT12((char)*buffer,buffer[2]));
  file_write((FILE *)__stream,&local_70,4);
  sVar20 = local_70 >> 0x18 & 0xff;
  if (sVar20 != 0) {
    buffer = buffer + 4;
LAB_00108444:
    file_write((FILE *)__stream,buffer,sVar20);
  }
  goto LAB_001083c5;
}

Assistant:

static void
anm_write(
    anm_archive_t* anm,
    const char* filename)
{
    FILE* stream;

    stream = fopen(filename, "wb");
    if (!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        exit(1);
    }

    anm_entry_t* entry;
    list_for_each(&anm->entries, entry) {
        sprite_t* sprite;
        anm_script_t* script;
        long base = file_tell(stream);
        unsigned int namepad = 0;
        static const char padding[16] = "";
        unsigned int j;
        unsigned int spriteoffset;

        namepad = (16 - strlen(entry->name) % 16);

        unsigned int sprite_count = 0;
        list_for_each(&entry->sprites, sprite)
            ++sprite_count;

        unsigned int script_count = 0;
        list_for_each(&entry->scripts, script)
            ++script_count;

        file_seek(stream, base +
                          sizeof(anm_header06_t) +
                          sprite_count * sizeof(uint32_t) +
                          script_count * sizeof(anm_offset_t));

        entry->header->nameoffset = file_tell(stream) - base;
        file_write(stream, entry->name, strlen(entry->name));
        file_write(stream, padding, namepad);

        if (entry->name2 && entry->header->version == 0) {
            namepad = (16 - strlen(entry->name2) % 16);

            entry->header->y = file_tell(stream) - base;
            file_write(stream, entry->name2, strlen(entry->name2));
            file_write(stream, padding, namepad);
        }

        spriteoffset = file_tell(stream) - base;

        list_for_each(&entry->sprites, sprite)
            file_write(stream, sprite, sizeof(*sprite));

        list_for_each(&entry->scripts, script) {
            script->offset->offset = file_tell(stream) - base;

            anm_instr_t* instr;
            list_for_each(&script->instrs, instr) {
                if (entry->header->version == 0) {
                    anm_instr0_t new_instr;
                    new_instr.time = instr->time;
                    new_instr.type = instr->type;
                    new_instr.length = instr->length;
                    file_write(stream, &new_instr, sizeof(new_instr));
                    if (new_instr.length) {
                        file_write(stream,
                            instr->data,
                            new_instr.length);
                    }
                } else {
                    if (instr->type == 0xffff) {
                        instr->length = 0;
                        file_write(stream, instr, sizeof(*instr));
                    } else {
                        instr->length += sizeof(*instr);
                        file_write(stream, instr, instr->length);
                    }
                }
            }

            if (entry->header->version == 0) {
                anm_instr0_t sentinel = { 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            } else {
                anm_instr_t sentinel = { 0xffff, 0, 0, 0 };
                file_write(stream, &sentinel, sizeof(sentinel));
            }
        }

        if (entry->header->hasdata) {
            entry->header->thtxoffset = file_tell(stream) - base;

            file_write(stream, entry->thtx, sizeof(thtx_header_t));
            file_write(stream, entry->data, entry->thtx->size);
        }

        if (list_is_last_iteration())
            entry->header->nextoffset = 0;
        else
            entry->header->nextoffset = file_tell(stream) - base;

        entry->header->sprites = sprite_count;
        entry->header->scripts = script_count;

        file_seek(stream, base);

        if (entry->header->version >= 7) {
            convert_header_to_11(entry->header);
            file_write(stream, entry->header, sizeof(anm_header06_t));
            convert_header_to_old(entry->header);
        } else {
            file_write(stream, entry->header, sizeof(anm_header06_t));
        }

        for (j = 0; j < sprite_count; ++j) {
            uint32_t ofs = spriteoffset + j * sizeof(sprite_t);
            file_write(stream, &ofs, sizeof(uint32_t));
        }

        list_for_each(&entry->scripts, script) {
            file_write(stream, script->offset, sizeof(*script->offset));
        }

        file_seek(stream, base + entry->header->nextoffset);
    }

    fclose(stream);
}